

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O1

void __thiscall antlr::CharScanner::resetText(CharScanner *this)

{
  Ref *pRVar1;
  LexerInputState *pLVar2;
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->text,0,(char *)(this->text)._M_string_length,0x1efbc9);
  pRVar1 = (this->inputState).ref;
  pLVar2 = pRVar1->ptr;
  pLVar2->tokenStartColumn = pLVar2->column;
  pRVar1->ptr->tokenStartLine = pLVar2->line;
  return;
}

Assistant:

virtual void resetText()
	{
		text = "";
		inputState->tokenStartColumn = inputState->column;
		inputState->tokenStartLine = inputState->line;
	}